

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

int svb_find_avx_d1_init
              (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,uint32_t key,
              uint32_t *presult)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte bVar9;
  ulong uVar8;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  xmm_t PrevLow;
  uint32_t out [32];
  
  iVar4 = 0;
  if (0x1f < count) {
    out._0_16_ = vpbroadcastd_avx512vl();
    uVar13 = 1;
    iVar4 = (int)(count >> 5) * 0x20;
    iVar5 = iVar4 + -0x20;
    iVar14 = 0x18;
    uVar8 = *(ulong *)keyPtr;
    while( true ) {
      auVar17 = vpshufd_avx(out._0_16_,0xff);
      bVar9 = (byte)(uVar8 >> 8);
      if (count >> 5 == uVar13) break;
      lVar1 = uVar13 * 8;
      if (uVar8 == 0) {
        auVar16 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
        auVar16 = vpmovzxbw_avx(auVar16);
        auVar18 = vpslldq_avx(auVar16,2);
        auVar16 = vpaddd_avx(auVar18,auVar16);
        auVar18 = vpslldq_avx(auVar16,4);
        auVar16 = vpaddd_avx(auVar16,auVar18);
        auVar18 = vpmovzxwd_avx(auVar16);
        auVar16 = vpunpckhwd_avx(auVar16,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar18);
        out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar16);
        if (key <= out[3]) goto LAB_0013eadb;
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
        auVar18 = vpshufd_avx(out._0_16_,0xff);
        auVar17 = vpmovzxbw_avx(auVar17);
        auVar16 = vpslldq_avx(auVar17,2);
        auVar17 = vpaddd_avx(auVar16,auVar17);
        auVar16 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar17,auVar16);
        auVar16 = vpmovzxwd_avx(auVar17);
        auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar18,auVar16);
        out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
        if (key <= out[3]) goto LAB_0013eaf9;
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar18 = vpshufd_avx(out._0_16_,0xff);
        auVar17 = vpmovzxbw_avx(auVar17);
        auVar16 = vpslldq_avx(auVar17,2);
        auVar17 = vpaddd_avx(auVar16,auVar17);
        auVar16 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar17,auVar16);
        auVar16 = vpmovzxwd_avx(auVar17);
        auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar18,auVar16);
        out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
        if (key <= out[3]) goto LAB_0013eb17;
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8));
        auVar18 = vpshufd_avx(out._0_16_,0xff);
        auVar17 = vpmovzxbw_avx(auVar17);
        auVar16 = vpslldq_avx(auVar17,2);
        auVar17 = vpaddd_avx(auVar16,auVar17);
        auVar16 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar17,auVar16);
        auVar16 = vpmovzxwd_avx(auVar17);
        auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar18,auVar16);
        out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
        if (key <= out[3]) goto LAB_0013eb35;
        dataPtr = (uint8_t *)((long)dataPtr + 0x20);
      }
      else {
        uVar11 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                        [uVar8 & 0xff];
        auVar16 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                              *(undefined1 (*) [16])
                               (shuffleTable[0] + (uint)((int)(uVar8 & 0xff) << 4)));
        auVar18 = vpslldq_avx(auVar16,4);
        auVar16 = vpaddd_avx(auVar18,auVar16);
        auVar17 = vpaddd_avx(auVar16,auVar17);
        auVar16 = vpslldq_avx(auVar16,8);
        PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
        auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar11),
                              (undefined1  [16])shuffleTable[bVar9]);
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar16 = vpaddd_avx(auVar17,auVar16);
        auVar17 = vpslldq_avx(auVar17,8);
        out._0_16_ = vpaddd_avx(auVar16,auVar17);
        if (key <= out[3]) {
LAB_0013eadb:
          iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
          count = (uint64_t)(uint)(iVar4 + -0x18 + iVar14);
          goto LAB_0013ed85;
        }
        auVar16 = vpshufd_avx(out._0_16_,0xff);
        uVar10 = (uint)uVar8 >> 0x10 & 0xff;
        lVar2 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [bVar9] + uVar11;
        uVar12 = uVar8 >> 0x18 & 0xff;
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [bVar9] + uVar11),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uVar10 << 4)));
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar18 = vpslldq_avx(auVar17,8);
        auVar17 = vpaddd_avx(auVar17,auVar18);
        PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
        auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar10] + lVar2),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar18 = vpslldq_avx(auVar17,8);
        auVar17 = vpaddd_avx(auVar17,auVar18);
        out._0_16_ = vpaddd_avx(auVar17,auVar16);
        if (key <= out[3]) {
LAB_0013eaf9:
          iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
          count = (uint64_t)(uint)(iVar4 + -0x10 + iVar14);
          goto LAB_0013ed85;
        }
        lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar10] + lVar2;
        auVar16 = vpshufd_avx(out._0_16_,0xff);
        uVar11 = uVar8 >> 0x20 & 0xff;
        lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar12] + lVar2;
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar12] + lVar2),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        uVar12 = uVar8 >> 0x28 & 0xff;
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar18 = vpslldq_avx(auVar17,8);
        auVar17 = vpaddd_avx(auVar17,auVar18);
        PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
        auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar11] + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar18 = vpslldq_avx(auVar17,8);
        auVar17 = vpaddd_avx(auVar17,auVar18);
        out._0_16_ = vpaddd_avx(auVar17,auVar16);
        if (key <= out[3]) {
LAB_0013eb17:
          iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
          count = (uint64_t)(uint)(iVar4 + -8 + iVar14);
          goto LAB_0013ed85;
        }
        lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar11] + lVar3;
        auVar16 = vpshufd_avx(out._0_16_,0xff);
        uVar11 = uVar8 >> 0x30 & 0xff;
        lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar12] + lVar3;
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar12] + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar18 = vpslldq_avx(auVar17,8);
        auVar17 = vpaddd_avx(auVar17,auVar18);
        PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
        auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar11] + lVar2),
                              (undefined1  [16])shuffleTable[uVar8 >> 0x38]);
        auVar18 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar18,auVar17);
        auVar18 = vpslldq_avx(auVar17,8);
        auVar17 = vpaddd_avx(auVar17,auVar18);
        out._0_16_ = vpaddd_avx(auVar17,auVar16);
        if (key <= out[3]) {
LAB_0013eb35:
          iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
          count = (uint64_t)(uint)(iVar4 + iVar14);
          goto LAB_0013ed85;
        }
        dataPtr = *(undefined1 (*) [16])dataPtr +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar8 >> 0x38] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar11] + lVar2;
      }
      uVar13 = uVar13 + 1;
      iVar14 = iVar14 + 0x20;
      uVar8 = *(ulong *)(keyPtr + lVar1);
    }
    if (uVar8 == 0) {
      auVar16 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
      auVar16 = vpmovzxbw_avx(auVar16);
      auVar18 = vpslldq_avx(auVar16,2);
      auVar16 = vpaddd_avx(auVar18,auVar16);
      auVar18 = vpslldq_avx(auVar16,4);
      auVar16 = vpaddd_avx(auVar16,auVar18);
      auVar18 = vpmovzxwd_avx(auVar16);
      PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar18);
      auVar17 = vpunpckhwd_avx(auVar16,(undefined1  [16])0x0);
      out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
      if (key <= out[3]) goto LAB_0013ed11;
      auVar17 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar18 = vpshufd_avx(out._0_16_,0xff);
      auVar17 = vpmovzxbw_avx(auVar17);
      auVar16 = vpslldq_avx(auVar17,2);
      auVar17 = vpaddd_avx(auVar16,auVar17);
      auVar16 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar17,auVar16);
      auVar16 = vpmovzxwd_avx(auVar17);
      auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
      PrevLow = (xmm_t)vpaddd_avx(auVar18,auVar16);
      out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
      if (key <= out[3]) goto LAB_0013ed2d;
      auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
      auVar18 = vpshufd_avx(out._0_16_,0xff);
      auVar17 = vpmovzxbw_avx(auVar17);
      auVar16 = vpslldq_avx(auVar17,2);
      auVar17 = vpaddd_avx(auVar16,auVar17);
      auVar16 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar17,auVar16);
      auVar16 = vpmovzxwd_avx(auVar17);
      PrevLow = (xmm_t)vpaddd_avx(auVar18,auVar16);
      auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
      out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
      if (key <= out[3]) goto LAB_0013ed4b;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
      auVar17 = vpmovzxbw_avx(auVar17);
      auVar18 = vpshufd_avx(out._0_16_,0xff);
      auVar16 = vpslldq_avx(auVar17,2);
      auVar17 = vpaddd_avx(auVar16,auVar17);
      auVar16 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar17,auVar16);
      auVar16 = vpmovzxwd_avx(auVar17);
      auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
      PrevLow = (xmm_t)vpaddd_avx(auVar18,auVar16);
      out._0_16_ = vpaddd_avx((undefined1  [16])PrevLow,auVar17);
      prev = out[3];
      if (key <= prev) goto LAB_0013ed69;
      dataPtr = (uint8_t *)((long)dataPtr + 0x20);
    }
    else {
      uVar13 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar8 & 0xff];
      auVar16 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                            *(undefined1 (*) [16])
                             (shuffleTable[0] + (uint)((int)(uVar8 & 0xff) << 4)));
      auVar18 = vpslldq_avx(auVar16,4);
      auVar16 = vpaddd_avx(auVar18,auVar16);
      auVar17 = vpaddd_avx(auVar16,auVar17);
      auVar16 = vpslldq_avx(auVar16,8);
      PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
      auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar13),
                            (undefined1  [16])shuffleTable[bVar9]);
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar16 = vpaddd_avx(auVar17,auVar16);
      auVar17 = vpslldq_avx(auVar17,8);
      out._0_16_ = vpaddd_avx(auVar16,auVar17);
      if (key <= out[3]) {
LAB_0013ed11:
        iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
        count = (uint64_t)(uint)(iVar4 + iVar5);
        goto LAB_0013ed85;
      }
      auVar16 = vpshufd_avx(out._0_16_,0xff);
      uVar10 = (uint)uVar8 >> 0x10 & 0xff;
      lVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar9] + uVar13;
      uVar11 = uVar8 >> 0x18 & 0xff;
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [bVar9] + uVar13),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uVar10 << 4)));
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar18 = vpslldq_avx(auVar17,8);
      auVar17 = vpaddd_avx(auVar17,auVar18);
      PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
      auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar10] + lVar1),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar18 = vpslldq_avx(auVar17,8);
      auVar17 = vpaddd_avx(auVar17,auVar18);
      out._0_16_ = vpaddd_avx(auVar17,auVar16);
      if (key <= out[3]) {
LAB_0013ed2d:
        iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
        count = (uint64_t)(uint)(iVar4 + 8 + iVar5);
        goto LAB_0013ed85;
      }
      lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar10] + lVar1;
      auVar16 = vpshufd_avx(out._0_16_,0xff);
      uVar13 = uVar8 >> 0x20 & 0xff;
      lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar11] + lVar1;
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar11] + lVar1),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
      uVar11 = uVar8 >> 0x28 & 0xff;
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar18 = vpslldq_avx(auVar17,8);
      auVar17 = vpaddd_avx(auVar17,auVar18);
      PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
      auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar13] + lVar2),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar18 = vpslldq_avx(auVar17,8);
      auVar17 = vpaddd_avx(auVar17,auVar18);
      out._0_16_ = vpaddd_avx(auVar17,auVar16);
      if (key <= out[3]) {
LAB_0013ed4b:
        iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
        count = (uint64_t)(uint)(iVar4 + 0x10 + iVar5);
        goto LAB_0013ed85;
      }
      lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar13] + lVar2;
      auVar16 = vpshufd_avx(out._0_16_,0xff);
      uVar13 = uVar8 >> 0x30 & 0xff;
      lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar11] + lVar2;
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar11] + lVar2),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar18 = vpslldq_avx(auVar17,8);
      auVar17 = vpaddd_avx(auVar17,auVar18);
      PrevLow = (xmm_t)vpaddd_avx(auVar17,auVar16);
      auVar16 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar17 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar13] + lVar1),(undefined1  [16])shuffleTable[uVar8 >> 0x38])
      ;
      auVar18 = vpslldq_avx(auVar17,4);
      auVar17 = vpaddd_avx(auVar18,auVar17);
      auVar18 = vpslldq_avx(auVar17,8);
      auVar17 = vpaddd_avx(auVar17,auVar18);
      out._0_16_ = vpaddd_avx(auVar17,auVar16);
      prev = out[3];
      if (key <= prev) {
LAB_0013ed69:
        iVar4 = find_lower_bound((__m128i *)out,&PrevLow,key,presult);
        count = (uint64_t)(uint)(iVar4 + 0x18 + iVar5);
        goto LAB_0013ed85;
      }
      dataPtr = *(undefined1 (*) [16])dataPtr +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar13] +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar8 >> 0x38] + lVar1;
    }
  }
  uVar10 = (uint)count & 0x1f;
  if ((count & 0x1f) != 0) {
    svb_decode_scalar_d1_init(out,keyPtr + (count >> 2 & 0xfffffffffffffff8),dataPtr,uVar10,prev);
    uVar13 = (ulong)(uVar10 - 1);
    if (key <= out[uVar13]) {
      uVar10 = 0;
      while (uVar15 = (uint)uVar13, (int)(uVar10 + 1) < (int)uVar15) {
        uVar6 = (int)(uVar15 - uVar10) / 2 + uVar10;
        uVar7 = uVar6;
        if (out[(int)uVar6] < key) {
          uVar7 = uVar15;
          uVar10 = uVar6;
        }
        uVar13 = (ulong)uVar7;
      }
      if (key <= out[(int)uVar10]) {
        uVar15 = uVar10;
      }
      count = (uint64_t)(uVar15 + iVar4);
      *presult = out[(int)uVar15];
      goto LAB_0013ed85;
    }
  }
  *presult = key + 1;
LAB_0013ed85:
  return (int)count;
}

Assistant:

int svb_find_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr, uint64_t count,
                         uint32_t prev, uint32_t key, uint32_t *presult) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }
        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 8 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 16 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 24 + s);
      }

      consumedInts += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint32_t keysleft = count & 31;
  if (keysleft > 0) {
    uint64_t consumedkeys = keybytes - (keybytes & 7);
    uint32_t out[32];
    svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr, keysleft,
                              prev);
    if (key <= out[keysleft - 1]) {
      int s = lower_bound(out, key, 0, keysleft);
      assert(s >= 0 && s < (int)keysleft);
      *presult = out[s];
      return (consumedInts + s);
    }
  }

  // key was not found!
  *presult = key + 1;
  return (int)count;
}